

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O0

bool cmQtAutoMocUic(string_view infoFile,string_view config)

{
  string_view config_00;
  string_view infoFile_00;
  bool bVar1;
  cmQtAutoMocUicT local_938;
  size_t sStack_28;
  string_view config_local;
  string_view infoFile_local;
  
  config_local._M_str = (char *)infoFile._M_len;
  config_local._M_len = (size_t)config._M_str;
  sStack_28 = config._M_len;
  anon_unknown.dwarf_1a2934::cmQtAutoMocUicT::cmQtAutoMocUicT(&local_938);
  infoFile_00._M_str = infoFile._M_str;
  infoFile_00._M_len = (size_t)config_local._M_str;
  config_00._M_str = (char *)config_local._M_len;
  config_00._M_len = sStack_28;
  bVar1 = cmQtAutoGenerator::Run(&local_938.super_cmQtAutoGenerator,infoFile_00,config_00);
  anon_unknown.dwarf_1a2934::cmQtAutoMocUicT::~cmQtAutoMocUicT(&local_938);
  return bVar1;
}

Assistant:

bool cmQtAutoMocUic(cm::string_view infoFile, cm::string_view config)
{
  return cmQtAutoMocUicT().Run(infoFile, config);
}